

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgr.hpp
# Opt level: O2

sgr * cpp_sgr::operator+(sgr *__return_storage_ptr__,sgr *left,sgr *right)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,&left->str,";");
  std::operator+(&bStack_58,&local_38,&right->str);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&bStack_58);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

sgr operator+(const sgr & left, const sgr & right)
		{
			return sgr(left.str + ";" + right.str);
		}